

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O2

char * xdg_get_paths(char *xdg_env,char *default_paths,xdg_paths *state,uint32_t max_iter)

{
  char *pcVar1;
  size_t sVar2;
  
  if (((xdg_env == (char *)0x0) || (default_paths == (char *)0x0)) || (state == (xdg_paths *)0x0)) {
    __assert_fail("xdg_env && default_paths && state",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/xdg.c",
                  0x52,
                  "const char *xdg_get_paths(const char *, const char *, struct xdg_paths *, uint32_t)"
                 );
  }
  pcVar1 = state->path;
  if (((pcVar1 == (char *)0x0) || (*pcVar1 != '\0')) && (state->iter != max_iter)) {
    state->iter = state->iter + 1;
    if (state->paths == (char *)0x0) {
      pcVar1 = getenv(xdg_env);
      if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
        pcVar1 = default_paths;
      }
      pcVar1 = ccopy(pcVar1);
      state->paths = pcVar1;
      state->path = pcVar1;
    }
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    do {
      pcVar1 = state->path;
      sVar2 = strcspn(pcVar1,":");
      if (sVar2 != 0) {
        state->path = pcVar1 + ((sVar2 + 1) - (ulong)(pcVar1[sVar2] == '\0'));
        pcVar1[sVar2] = '\0';
      }
      if (*pcVar1 == '/') {
        pcVar1 = strip_slash(pcVar1);
        return pcVar1;
      }
    } while (*pcVar1 != '\0');
  }
  free(state->paths);
  return (char *)0x0;
}

Assistant:

const char*
xdg_get_paths(const char *xdg_env, const char *default_paths, struct xdg_paths *state, uint32_t max_iter)
{
   assert(xdg_env && default_paths && state);

   if ((state->path && !*state->path) || state->iter == max_iter) {
      free((char*)state->paths);
      return NULL;
   }

   ++state->iter;

   if (!state->paths) {
      if (!xdg_env || !default_paths)
         return NULL;

      const char *paths;
      if (!(paths = getenv(xdg_env)) || !paths[0])
         paths = default_paths;

      state->path = state->paths = ccopy(paths);
   }

   if (!state->path || !state->paths)
      return NULL;

   char *path;
   do {
      size_t f;
      path = (char*)state->path;
      if ((f = strcspn(state->path, ":")) > 0) {
         state->path += f + (path[f] ? 1 : 0);
         path[f] = 0;
      }

      if (!*path) {
         free((char*)state->paths);
         return NULL;
      }
   } while (path[0] != '/');

   return strip_slash(path);
}